

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O0

void qrfac(double *A,int M,int N,int lda,int pivot,int *ipvt,int lipvt,double *rdiag,double *acnorm,
          double eps)

{
  int iVar1;
  double *col;
  void *__ptr;
  double *x;
  int iVar2;
  double dVar3;
  double dVar4;
  double *wa2;
  double *wa;
  double *AT;
  double pmaxval;
  double temp2;
  double zero;
  double temp;
  double sum;
  double p05;
  double one;
  double epsmch;
  double ajnorm;
  int local_48;
  int t;
  int minmn;
  int kmax;
  int k;
  int jp1;
  int j;
  int i;
  double eps_local;
  int *ipvt_local;
  int pivot_local;
  int lda_local;
  int N_local;
  int M_local;
  double *A_local;
  
  if ((pivot != 0) && (pivot != 1)) {
    printf("Pivot only takes binary values 0 and 1 \n");
    exit(-1);
  }
  col = (double *)malloc((long)N * 8 * (long)M);
  __ptr = malloc((long)N << 3);
  x = (double *)malloc((long)M << 3);
  mtranspose(A,M,N,col);
  for (k = 0; k < N; k = k + 1) {
    dVar3 = enorm(col + k * M,M);
    acnorm[k] = dVar3;
    rdiag[k] = acnorm[k];
    *(double *)((long)__ptr + (long)k * 8) = rdiag[k];
    if (pivot == 1) {
      ipvt[k] = k;
    }
  }
  local_48 = N;
  if (M < N) {
    local_48 = M;
  }
  for (k = 0; k < local_48; k = k + 1) {
    if (pivot == 1) {
      t = k;
      for (minmn = k; minmn < N; minmn = minmn + 1) {
        if (rdiag[t] <= rdiag[minmn] && rdiag[minmn] != rdiag[t]) {
          t = minmn;
        }
      }
      if (t != k) {
        for (jp1 = 0; jp1 < M; jp1 = jp1 + 1) {
          iVar1 = jp1 * N;
          dVar3 = A[iVar1 + k];
          A[iVar1 + k] = A[iVar1 + t];
          A[iVar1 + t] = dVar3;
        }
        rdiag[t] = rdiag[k];
        *(undefined8 *)((long)__ptr + (long)t * 8) = *(undefined8 *)((long)__ptr + (long)k * 8);
        iVar1 = ipvt[k];
        ipvt[k] = ipvt[t];
        ipvt[t] = iVar1;
      }
    }
    iVar1 = k * N + k;
    for (jp1 = 0; jp1 < M - k; jp1 = jp1 + 1) {
      x[jp1] = A[iVar1 + jp1 * N];
    }
    epsmch = enorm(x,M - k);
    if ((epsmch != 0.0) || (NAN(epsmch))) {
      if (A[iVar1] < 0.0) {
        epsmch = -epsmch;
      }
      for (jp1 = k; jp1 < M; jp1 = jp1 + 1) {
        iVar2 = jp1 * N + k;
        A[iVar2] = A[iVar2] / epsmch;
      }
      A[iVar1] = A[iVar1] + 1.0;
      minmn = k + 1;
      if (k + 2 <= N) {
        for (; minmn < N; minmn = minmn + 1) {
          temp = 0.0;
          for (jp1 = k; jp1 < M; jp1 = jp1 + 1) {
            temp = A[jp1 * N + k] * A[jp1 * N + minmn] + temp;
          }
          dVar3 = A[iVar1];
          for (jp1 = k; jp1 < M; jp1 = jp1 + 1) {
            iVar2 = jp1 * N + minmn;
            A[iVar2] = -(temp / dVar3) * A[jp1 * N + k] + A[iVar2];
          }
          if ((pivot == 1) && ((rdiag[minmn] != 0.0 || (NAN(rdiag[minmn]))))) {
            dVar4 = pmax(0.0,-(A[k * N + minmn] / rdiag[minmn]) * (A[k * N + minmn] / rdiag[minmn])
                             + 1.0);
            dVar3 = rdiag[minmn];
            dVar4 = sqrt(dVar4);
            rdiag[minmn] = dVar3 * dVar4;
            dVar3 = (rdiag[minmn] / *(double *)((long)__ptr + (long)minmn * 8)) * 0.05;
            if (dVar3 * dVar3 <= eps) {
              for (jp1 = 0; jp1 < (M - k) + -1; jp1 = jp1 + 1) {
                x[jp1] = A[(k + 1) * N + minmn + jp1 * N];
              }
              dVar3 = enorm(x,(M - k) + -1);
              rdiag[minmn] = dVar3;
              *(double *)((long)__ptr + (long)minmn * 8) = rdiag[minmn];
            }
          }
        }
      }
    }
    rdiag[k] = -epsmch;
  }
  free(col);
  free(__ptr);
  free(x);
  return;
}

Assistant:

void qrfac(double *A, int M, int N, int lda, int pivot, int *ipvt, int lipvt,double *rdiag, double *acnorm,double eps) {
	int i,j,jp1,k,kmax,minmn,t;
    double ajnorm,epsmch,one,p05,sum,temp,zero,temp2,pmaxval;
    double *AT,*wa,*wa2;

 /*
     * This routine is a C translation of Fortran Code by
     *     argonne national laboratory. minpack project. march 1980.
      burton s. garbow, kenneth e. hillstrom, jorge j. more
     *
     * M is a positive integer input variable set to the number
         of rows of a.

       N is a positive integer input variable set to the number
         of columns of a.

       A is an M by N array. on input a contains the matrix for
         which the qr factorization is to be computed. on output
         the strict upper trapezoidal part of a contains the strict
         upper trapezoidal part of r, and the lower trapezoidal
         part of a contains a factored form of q (the non-trivial
         elements of the u vectors described above).

       lda is a positive integer input variable not less than m
         which specifies the leading dimension of the array a.

       pivot is an integer input variable. if pivot is set to 1,
         then column pivoting is enforced. if pivot is set to 0,
         then no column pivoting is done.

       ipvt is an integer output array of length lipvt. ipvt
         defines the permutation matrix p such that a*p = q*r.
         column j of p is column ipvt(j) of the identity matrix.
         if pivot is false, ipvt is not referenced.

       lipvt is a positive integer input variable. if pivot is false,
         then lipvt may be as small as 1. if pivot is true, then
         lipvt must be at least n.

       rdiag is an output array of length N which contains the
         diagonal elements of r.

       acnorm is an output array of length N which contains the
         norms of the corresponding columns of the input matrix a.
         if this information is not needed, then acnorm can coincide
         with rdiag.
     *
     */


    if (pivot != 0 && pivot != 1) {
    	printf("Pivot only takes binary values 0 and 1 \n");
    	exit(-1);
    }

    AT = (double*) malloc(sizeof(double) *N*M);
    wa = (double*) malloc(sizeof(double) *N);
    wa2 = (double*) malloc(sizeof(double) *M);

    one = 1.0; zero = 0.0; p05 = 5.0e-02;
    epsmch = eps;

    mtranspose(A,M,N,AT);// AT is size NXM

    //compute the initial column norms and initialize several arrays.

    for(j = 0; j < N;++j) {
    	acnorm[j] = enorm(AT+j*M,M);
    	rdiag[j] = acnorm[j];
    	wa[j] = rdiag[j];
    	if (pivot == 1) {
    		ipvt[j] = j;
    	}
    }

    //reduce a to r with householder transformations.

    if (M < N) {
    	minmn = M;
    } else {
    	minmn = N;
    }

    for (j = 0; j < minmn;++j) {
    	if (pivot == 1) {
    		//bring the column of largest norm into the pivot position.
    		kmax = j;
    		for(k = j; k < N;++k) {
    			if (rdiag[k] > rdiag[kmax]) {
    				kmax = k;
    			}
    		}
			if (kmax != j) {
				for(i = 0; i < M;++i) {
					t = i * N;
					temp = A[t+j];
					A[t+j] = A[t+kmax];
					A[t+kmax] = temp;
				}
				rdiag[kmax] = rdiag[j];
				wa[kmax] = wa[j];
				k = ipvt[j];
				ipvt[j] = ipvt[kmax];
				ipvt[kmax] = k;
			}
    	}
    	//        compute the householder transformation to reduce the
    	//       j-th column of a to a multiple of the j-th unit vector.
    	t = j * N + j;

    	for(i = 0; i < M-j;++i) {
    		wa2[i] = A[t+i*N];
    	}
    	ajnorm = enorm(wa2,M-j);
    	if (ajnorm != zero) {
    		if (A[t] < zero) {
    			ajnorm = - ajnorm;
    		}
    		for(i = j; i < M;++i) {
    			A[i*N+j] /= ajnorm;
    		}
    		A[t] += one;
    		//        apply the transformation to the remaining columns
    		//        and update the norms.

    		jp1 = j + 1; // Breakpoint
    		if (N >= jp1+1) {
    			for(k = jp1; k < N;++k) {
    				sum = zero;
    				for(i = j; i < M;++i) {
    					sum += (A[i*N+j] * A[i*N+k]);
    				}
    				temp = sum / A[t];
    				for(i = j; i < M;++i) {
    					A[i*N+k] -= (temp * A[i*N+j]);
    				}
    				// Breakpoint 2
    				if (pivot == 1 && rdiag[k] != zero) {
    					temp = A[j*N+k] / rdiag[k];
						pmaxval = pmax(zero, one - temp*temp);
    					rdiag[k] = rdiag[k]*sqrt(pmaxval);
    					temp2 = (p05*(rdiag[k]/wa[k]));
    					temp2 = temp2 * temp2;
    					if (temp2 <= epsmch) {
    				    	for(i = 0; i < M-j-1;++i) {
    				    		wa2[i] = A[jp1*N+k+i*N];
    				    	}
    				    	rdiag[k] = enorm(wa2,M-j-1);
    				    	wa[k] = rdiag[k];
    					}
    				}
    			}
    		}
    	}
    	rdiag[j] = -ajnorm;
    }

    free(AT);
    free(wa);
    free(wa2);
}